

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

bool __thiscall
glcts::ViewportArray::ViewportIndexSubroutine::checkResults
          (ViewportIndexSubroutine *this,texture *texture_0,texture *param_2,GLuint draw_call_index)

{
  bool bVar1;
  bool bVar2;
  GLuint y;
  GLuint GVar3;
  GLuint GVar4;
  vector<int,_std::allocator<int>_> texture_data;
  vector<int,_std::allocator<int>_> local_38;
  
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (GLint *)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&local_38,0x4000);
  Utils::texture::get(texture_0,0x8d94,0x1404,
                      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  GVar3 = 0;
  do {
    GVar4 = 0;
    bVar2 = true;
    do {
      bVar1 = bVar2;
      bVar2 = DrawTestBase::checkRegionR32I
                        (&this->super_DrawTestBase,GVar4,GVar3,0x20,0x20,4,
                         local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      if (!bVar2) goto LAB_00dd0e32;
      GVar4 = 1;
      bVar2 = false;
    } while (bVar1);
    GVar3 = GVar3 + 1;
  } while (GVar3 != 4);
  GVar3 = 0;
  do {
    GVar4 = 2;
    do {
      bVar2 = DrawTestBase::checkRegionR32I
                        (&this->super_DrawTestBase,GVar4,GVar3,0x20,0x20,
                         -(uint)(draw_call_index != 1) | 5,
                         local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
      if (!bVar2) goto LAB_00dd0e32;
      GVar4 = GVar4 + 1;
    } while (GVar4 != 4);
    GVar3 = GVar3 + 1;
    bVar2 = true;
  } while (GVar3 != 4);
LAB_00dd0e35:
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (GLint *)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar2;
LAB_00dd0e32:
  bVar2 = false;
  goto LAB_00dd0e35;
}

Assistant:

bool ViewportIndexSubroutine::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */,
										   GLuint		   draw_call_index)
{
	bool check_result = true;

	std::vector<GLint> texture_data;
	texture_data.resize(m_width * m_height);
	texture_0.get(GL_RED_INTEGER, GL_INT, &texture_data[0]);

	/* Left is 4 and right is -1, or left is 4 and right is 5 */
	GLint expected_left  = 4;
	GLint expected_right = (1 == draw_call_index) ? 5 : -1;

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 0; x < 2; ++x)
		{
			bool result = checkRegionR32I(x, y, expected_left, &texture_data[0]);

			if (false == result)
			{
				check_result = false;
				goto end;
			}
		}
	}

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 2; x < 4; ++x)
		{
			bool result = checkRegionR32I(x, y, expected_right, &texture_data[0]);

			if (false == result)
			{
				check_result = false;
				goto end;
			}
		}
	}

end:
	return check_result;
}